

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::MemberSyntax*>::emplaceRealloc<slang::syntax::MemberSyntax*>
          (SmallVectorBase<slang::syntax::MemberSyntax*> *this,pointer pos,MemberSyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppMVar3;
  MemberSyntax **__result;
  MemberSyntax **ppMVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  MemberSyntax **args_local;
  pointer pos_local;
  SmallVectorBase<slang::syntax::MemberSyntax_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<slang::syntax::MemberSyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<slang::syntax::MemberSyntax_*>::calculateGrowth
                       ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this,
                        *(long *)(this + 8) + 1);
  ppMVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::begin
                      ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
  __result = (MemberSyntax **)slang::detail::allocArray(capacity,8);
  ppMVar4 = __result + ((long)pos - (long)ppMVar3 >> 3);
  *ppMVar4 = *args;
  ppMVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::end
                      ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
  if (pos == ppMVar3) {
    ppMVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::MemberSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
    std::uninitialized_move<slang::syntax::MemberSyntax**,slang::syntax::MemberSyntax**>
              (ppMVar3,(MemberSyntax **)ctx,__result);
  }
  else {
    ppMVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
    std::uninitialized_move<slang::syntax::MemberSyntax**,slang::syntax::MemberSyntax**>
              (ppMVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::MemberSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
    std::uninitialized_move<slang::syntax::MemberSyntax**,slang::syntax::MemberSyntax**>
              (pos,(MemberSyntax **)ctx,ppMVar4 + 1);
  }
  SmallVectorBase<slang::syntax::MemberSyntax_*>::cleanup
            ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(MemberSyntax ***)this = __result;
  return ppMVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}